

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFPdu.cpp
# Opt level: O2

void __thiscall DIS::IFFPdu::~IFFPdu(IFFPdu *this)

{
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__IFFPdu_001c1e60;
  std::vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>::
  clear(&this->_iffParameters);
  std::vector<DIS::IFFFundamentalParameterData,_std::allocator<DIS::IFFFundamentalParameterData>_>::
  ~vector(&this->_iffParameters);
  SecondaryOperationalData::~SecondaryOperationalData(&this->_secondaryOperationalData);
  BeamData::~BeamData(&this->_beamData);
  LayerHeader::~LayerHeader(&this->_layerHeader);
  FundamentalOperationalData::~FundamentalOperationalData(&this->_fundamentalOperationalData);
  SystemIdentifier::~SystemIdentifier(&this->_systemID);
  Vector3Float::~Vector3Float(&this->_relativeAntennaLocation);
  EventIdentifier::~EventIdentifier(&this->_eventID);
  EntityID::~EntityID(&this->_emittingEntityID);
  DistributedEmissionsFamilyPdu::~DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  return;
}

Assistant:

IFFPdu::~IFFPdu()
{
    _iffParameters.clear();
}